

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_expr.hh
# Opt level: O0

Const * convert_int_to_const<kratos::Var>(int64_t value,Var *var)

{
  bool bVar1;
  uint32_t width_00;
  bool *pbVar2;
  Const *pCVar3;
  Var *pVVar4;
  Const *c;
  uint32_t width;
  bool is_signed;
  Var *var_local;
  int64_t value_local;
  
  pbVar2 = kratos::Var::is_signed(var);
  bVar1 = *pbVar2;
  width_00 = (*(var->super_IRNode)._vptr_IRNode[7])();
  pCVar3 = kratos::constant(value,width_00,(bool)(bVar1 & 1));
  bVar1 = kratos::Var::parametrized(var);
  if (bVar1) {
    pVVar4 = kratos::Var::width_param(var);
    (*(pCVar3->super_Var).super_IRNode._vptr_IRNode[0x23])(pCVar3,pVVar4);
  }
  return pCVar3;
}

Assistant:

kratos::Const &convert_int_to_const(int64_t value, T &var) {
    bool is_signed = var.is_signed();
    uint32_t width = var.width();
    auto &c = kratos::constant(value, width, is_signed);
    if (var.parametrized()) c.set_width_param(var.width_param());
    return c;
}